

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O0

string * __thiscall
cmLinkLineComputer::ComputeLinkLibs_abi_cxx11_
          (string *__return_storage_ptr__,cmLinkLineComputer *this,cmComputeLinkInformation *cli)

{
  bool bVar1;
  TargetType TVar2;
  ItemVector *this_00;
  string local_a0;
  string local_80;
  reference local_60;
  Item *item;
  const_iterator __end1;
  const_iterator __begin1;
  ItemVector *__range1;
  ItemVector *items;
  cmComputeLinkInformation *cli_local;
  cmLinkLineComputer *this_local;
  string *linkLibs;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  this_00 = cmComputeLinkInformation::GetItems(cli);
  __end1 = std::
           vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
           begin(this_00);
  item = (Item *)std::
                 vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                 ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                                     *)&item), bVar1) {
    local_60 = __gnu_cxx::
               __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
               ::operator*(&__end1);
    if ((local_60->Target == (cmGeneratorTarget *)0x0) ||
       (TVar2 = cmGeneratorTarget::GetType(local_60->Target), TVar2 != INTERFACE_LIBRARY)) {
      if ((local_60->IsPath & 1U) == 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_60);
      }
      else {
        (*this->_vptr_cmLinkLineComputer[2])(&local_a0,this,local_60);
        ConvertToOutputFormat(&local_80,this,&local_a0);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    }
    __gnu_cxx::
    __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ComputeLinkLibs(cmComputeLinkInformation& cli)
{
  std::string linkLibs;
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  for (auto const& item : items) {
    if (item.Target &&
        item.Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    if (item.IsPath) {
      linkLibs +=
        this->ConvertToOutputFormat(this->ConvertToLinkReference(item.Value));
    } else {
      linkLibs += item.Value;
    }
    linkLibs += " ";
  }
  return linkLibs;
}